

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

iterator __thiscall
first_fit_heap<16UL>::free_list_container::insert_after
          (free_list_container *this,header_free *val,iterator other)

{
  byte *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  header_used *phVar3;
  undefined8 *puVar4;
  ulong uVar5;
  
  if (val != (header_free *)0x0) {
    if (val <= other.block) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &__cxxabiv1::__si_class_type_info::vtable;
      __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
    }
    if (other.block == (header_free *)0x0) {
      val->next_ = this->list;
      uVar5 = (val->super_header_used).raw;
      *(ulong *)((long)&(val->super_header_used).canary + (uVar5 & 0x3fffffffffffffff)) =
           uVar5 & 0x3fffffffffffffff;
      this->list = val;
    }
    else {
      val->next_ = (other.block)->next_;
      uVar5 = (val->super_header_used).raw;
      *(ulong *)((long)&(val->super_header_used).canary + (uVar5 & 0x3fffffffffffffff)) =
           uVar5 & 0x3fffffffffffffff;
      (other.block)->next_ = val;
    }
    (val->super_header_used).raw = uVar5 | 0x4000000000000000;
    iVar2 = (*this->mem->_vptr_memory[4])();
    phVar3 = header_used::preceding_block(&val->super_header_used,this->mem);
    if ((long)&val->next_ + (uVar5 & 0x3fffffffffffffff) < CONCAT44(extraout_var,iVar2)) {
      pbVar1 = (byte *)((long)&val->next_ + (uVar5 & 0x3fffffffffffffff) + 7);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((phVar3 != (header_used *)0x0) && ((phVar3->raw & 0x4000000000000000) != 0)) {
      pbVar1 = (byte *)((long)&(val->super_header_used).raw + 7);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  return (iterator)val;
}

Assistant:

iterator insert_after(header_free *val, iterator other)
        {
            if (not val) {
                return {};
            }

            ASSERT_HEAP(val > *other);

            if (other == end()) {
                // insert at list head
                val->next(list);
                val->is_free(true);
                val->update_footer();
                list = val;
            } else {
                // insert block into chain
                auto *tmp = (*other)->next();
                val->next(tmp);
                val->is_free(true);
                val->update_footer();

                ASSERT_HEAP(val != *other);
                (*other)->next(val);
            }

            // update meta data of surrounding blocks
            auto       *following = val->following_block(mem);
            const auto *preceding = val->preceding_block(mem);

            if (following) {
                following->prev_free(true);
            }

            if (preceding and preceding->is_free()) {
                val->prev_free(true);
            }

            return {val};
        }